

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# direct_bit_encoder.h
# Opt level: O1

void __thiscall
draco::DirectBitEncoder::EncodeLeastSignificantBits32
          (DirectBitEncoder *this,int nbits,uint32_t value)

{
  uint32_t uVar1;
  iterator iVar2;
  uint uVar3;
  uint uVar4;
  uint32_t uVar5;
  
  uVar1 = this->num_local_bits_;
  uVar4 = value << (-(char)nbits & 0x1fU);
  uVar5 = nbits - (0x20 - uVar1);
  if (uVar5 == 0 || nbits < (int)(0x20 - uVar1)) {
    uVar4 = uVar4 >> ((byte)uVar1 & 0x1f) | this->local_bits_;
    this->local_bits_ = uVar4;
    this->num_local_bits_ = nbits + uVar1;
    if (nbits + uVar1 == 0x20) {
      iVar2._M_current =
           (this->bits_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_finish;
      if (iVar2._M_current ==
          (this->bits_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<unsigned_int,std::allocator<unsigned_int>>::
        _M_realloc_insert<unsigned_int_const&>
                  ((vector<unsigned_int,std::allocator<unsigned_int>> *)this,iVar2,
                   &this->local_bits_);
      }
      else {
        *iVar2._M_current = uVar4;
        (this->bits_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_finish = iVar2._M_current + 1;
      }
      this->local_bits_ = 0;
      this->num_local_bits_ = 0;
    }
  }
  else {
    uVar4 = uVar4 >> (0x20U - (char)nbits & 0x1f);
    this->num_local_bits_ = uVar5;
    uVar3 = uVar4 >> ((byte)uVar5 & 0x1f) | this->local_bits_;
    this->local_bits_ = uVar3;
    iVar2._M_current =
         (this->bits_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
         super__Vector_impl_data._M_finish;
    if (iVar2._M_current ==
        (this->bits_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<unsigned_int,std::allocator<unsigned_int>>::_M_realloc_insert<unsigned_int_const&>
                ((vector<unsigned_int,std::allocator<unsigned_int>> *)this,iVar2,&this->local_bits_)
      ;
    }
    else {
      *iVar2._M_current = uVar3;
      (this->bits_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish = iVar2._M_current + 1;
    }
    this->local_bits_ = uVar4 << (-(char)this->num_local_bits_ & 0x1fU);
  }
  return;
}

Assistant:

void EncodeLeastSignificantBits32(int nbits, uint32_t value) {
    DRACO_DCHECK_EQ(true, nbits <= 32);
    DRACO_DCHECK_EQ(true, nbits > 0);

    const int remaining = 32 - num_local_bits_;

    // Make sure there are no leading bits that should not be encoded and
    // start from here.
    value = value << (32 - nbits);
    if (nbits <= remaining) {
      value = value >> num_local_bits_;
      local_bits_ = local_bits_ | value;
      num_local_bits_ += nbits;
      if (num_local_bits_ == 32) {
        bits_.push_back(local_bits_);
        local_bits_ = 0;
        num_local_bits_ = 0;
      }
    } else {
      value = value >> (32 - nbits);
      num_local_bits_ = nbits - remaining;
      const uint32_t value_l = value >> num_local_bits_;
      local_bits_ = local_bits_ | value_l;
      bits_.push_back(local_bits_);
      local_bits_ = value << (32 - num_local_bits_);
    }
  }